

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quota.cc
# Opt level: O3

void * thread_routine(void *vparam)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  void *pvVar8;
  
  lVar7 = 0;
  uVar6 = 0;
  pvVar8 = (void *)0x0;
  do {
    pvVar8 = (void *)((long)pvVar8 +
                     (ulong)((quota.value >> 0x16 & 0x3fffffffc00) <
                            (quota.value & 0xffffffff) << 10));
    iVar1 = rand();
    uVar4 = (ulong)(long)iVar1 % 0x3fffffffc00 + 0x3ff;
    uVar2 = uVar4 >> 10;
    if ((uint)uVar2 < (uint)quota.value) {
      sched_yield();
      uVar4 = 0xffffffffffffffff;
    }
    else {
      quota.value = quota.value & 0xffffffff | uVar2 << 0x20;
      LOCK();
      UNLOCK();
      sched_yield();
      uVar4 = uVar4 & 0x3fffffffc00;
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        *(ulong *)((long)vparam + 8) = uVar4;
        *(long *)((long)vparam + 0x18) = *(long *)((long)vparam + 0x18) + 1;
      }
    }
    if ((long)uVar6 < 1) {
      iVar1 = rand();
      lVar3 = (long)iVar1 % (long)uVar4;
      uVar6 = 0xffffffffffffffff;
      if (lVar3 + 1U < 0x3fffffffc01) {
        if (lVar3 == -1) {
          __assert_fail("size_in_units",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                        ,0x89,"ssize_t quota_use(struct quota *, size_t)");
        }
        uVar5 = (uint)quota.value + (int)(lVar3 + 0x400U >> 10);
        if (uVar5 <= (uint)quota.value) {
          __assert_fail("new_used_in_units > used_in_units",
                        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                        ,0x90,"ssize_t quota_use(struct quota *, size_t)");
        }
        if (uVar5 <= (uint)(quota.value >> 0x20)) {
          quota.value = (ulong)uVar5 | quota.value & 0xffffffff00000000;
          LOCK();
          UNLOCK();
          uVar2 = lVar3 + 0x400U & 0x3fffffffc00;
          uVar6 = uVar2;
          if (uVar2 != 0) goto LAB_00101465;
          uVar6 = 0;
        }
      }
    }
    else {
      uVar5 = (uint)(uVar6 + 0x3ff >> 10);
      if ((uint)quota.value < uVar5) {
        __assert_fail("size_in_units <= used_in_units",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/quota.h"
                      ,0xab,"ssize_t quota_release(struct quota *, size_t)");
      }
      quota.value = (ulong)((uint)quota.value - uVar5) | quota.value & 0xffffffff00000000;
      LOCK();
      UNLOCK();
      uVar2 = 0;
      uVar6 = 0xffffffffffffffff;
LAB_00101465:
      *(ulong *)vparam = uVar2;
      *(long *)((long)vparam + 0x10) = *(long *)((long)vparam + 0x10) + 1;
    }
    sched_yield();
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x20000) {
      return pvVar8;
    }
  } while( true );
}

Assistant:

void *thread_routine(void *vparam)
{
	struct thread_data *data = (struct thread_data *)vparam;
	size_t check_fail_count = 0;
	ssize_t allocated_size = 0;
	for (size_t i = 0; i < RUN_CNT; i++) {
		{
			size_t total, used;
			quota_get_total_and_used(&quota, &total, &used);
			if (used > total)
				check_fail_count++;
		}
		ssize_t max = rand() % QUOTA_MAX;
		max = quota_set(&quota, max);
		sched_yield();
		if (max > 0) {
			data->last_lim_set = max;
			data->lim_change_success++;
		}
		if (allocated_size > 0) {
			quota_release(&quota, allocated_size);
			allocated_size = -1;
			data->use_change = 0;
			data->use_change_success++;
			sched_yield();
		} else {
			allocated_size = rand() % max + 1;
			allocated_size = quota_use(&quota, allocated_size);
			if (allocated_size > 0) {
				data->use_change = allocated_size;
				data->use_change_success++;
			}
			sched_yield();
		}
	}
	return (void *)check_fail_count;
}